

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O0

void __thiscall spdlog::spdlog_ex::spdlog_ex(spdlog_ex *this,string *msg,int last_errno)

{
  undefined4 in_EDX;
  exception *in_RDI;
  memory_buf_t outbuf;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_00;
  string local_180 [24];
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  allocator<char> local_139;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> local_138;
  undefined4 local_14;
  
  local_14 = in_EDX;
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__spdlog_ex_002b9d30;
  std::__cxx11::string::string((string *)(in_RDI + 8));
  std::allocator<char>::allocator();
  ::fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffe60,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::allocator<char>::~allocator(&local_139);
  ::fmt::v6::basic_string_view<char>::basic_string_view<std::char_traits<char>,std::allocator<char>>
            ((basic_string_view<char> *)in_stack_fffffffffffffe60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(local_14,in_stack_fffffffffffffe58));
  this_00 = &local_138;
  ::fmt::v6::format_system_error
            ((buffer<char> *)outbuf.store_._160_8_,outbuf.store_._156_4_,
             (string_view)outbuf.store_._168_16_);
  ::fmt::v6::to_string<char,250ul>(in_stack_fffffffffffffe98);
  std::__cxx11::string::operator=((string *)(in_RDI + 8),local_180);
  std::__cxx11::string::~string(local_180);
  ::fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer(this_00);
  return;
}

Assistant:

SPDLOG_INLINE spdlog_ex::spdlog_ex(const std::string &msg, int last_errno)
{
    memory_buf_t outbuf;
    fmt::format_system_error(outbuf, last_errno, msg);
    msg_ = fmt::to_string(outbuf);
}